

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O1

void __thiscall Hes_Apu::end_frame(Hes_Apu *this,blip_time_t end_time)

{
  long lVar1;
  Hes_Osc *this_00;
  
  this_00 = this->oscs + 5;
  lVar1 = -0x2a0;
  do {
    if (this_00->last_time < end_time) {
      Hes_Osc::run_until(this_00,&this->synth,end_time);
    }
    this_00->last_time = this_00->last_time - end_time;
    this_00 = this_00 + -1;
    lVar1 = lVar1 + 0x70;
  } while (lVar1 != 0);
  return;
}

Assistant:

void Hes_Apu::end_frame( blip_time_t end_time )
{
	Hes_Osc* osc = &oscs [osc_count];
	do
	{
		osc--;
		if ( end_time > osc->last_time )
			osc->run_until( synth, end_time );
		assert( osc->last_time >= end_time );
		osc->last_time -= end_time;
	}
	while ( osc != oscs );
}